

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Sweep.c
# Opt level: O1

void Llb4_Nonlin4SweepExperiment(Aig_Man_t *pAig)

{
  Vec_Ptr_t *vGroups;
  Vec_Int_t *vOrder;
  DdManager *dd;
  Vec_Ptr_t *local_30;
  Vec_Int_t *local_28;
  DdManager *local_20;
  
  Llb4_Nonlin4Sweep(pAig,100,500,&local_20,&local_28,&local_30,1);
  Llb_Nonlin4SweepDeref(local_20,local_30);
  Cudd_RecursiveDeref(local_20,local_20->bFunc);
  Extra_StopManager(local_20);
  if (local_28->pArray != (int *)0x0) {
    free(local_28->pArray);
    local_28->pArray = (int *)0x0;
  }
  if (local_28 != (Vec_Int_t *)0x0) {
    free(local_28);
    return;
  }
  return;
}

Assistant:

void Llb4_Nonlin4SweepExperiment( Aig_Man_t * pAig )
{
    DdManager * dd;
    Vec_Int_t * vOrder;
    Vec_Ptr_t * vGroups;
    Llb4_Nonlin4Sweep( pAig, 100, 500, &dd, &vOrder, &vGroups, 1 );

    Llb_Nonlin4SweepDeref( dd, vGroups );

    Cudd_RecursiveDeref( dd, dd->bFunc );
    Extra_StopManager( dd );
    Vec_IntFree( vOrder );
}